

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesAlbum.cpp
# Opt level: O0

void __thiscall ResourcesAlbum::clear(ResourcesAlbum *this)

{
  bool bVar1;
  pointer ppVar2;
  ResourceContentWrapper *cntWr;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_> local_18;
  iterator cntItr;
  ResourcesAlbum *this_local;
  
  cntItr._M_node = (_Base_ptr)this;
  clearLeafsContent(this);
  std::_Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
  _Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
             ::begin(&this->leafToContentWrapper);
  local_18._M_node = local_20;
  while( true ) {
    cntWr = (ResourceContentWrapper *)
            std::
            map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
            ::end(&this->leafToContentWrapper);
    bVar1 = std::operator!=(&local_18,(_Self *)&cntWr);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
             operator->(&local_18);
    if (ppVar2->second != (ResourceContentWrapper *)0x0) {
      (*(ppVar2->second->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
        _vptr_AbstractByteBuffer[1])();
    }
    std::_Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
    operator++(&local_18);
  }
  std::
  map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
  ::clear(&this->leafToContentWrapper);
  std::
  map<long,_std::vector<ResourceLeafWrapper_*,_std::allocator<ResourceLeafWrapper_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<ResourceLeafWrapper_*,_std::allocator<ResourceLeafWrapper_*>_>_>_>_>
  ::clear(&this->allLeafs);
  std::vector<pe::resource_type,_std::allocator<pe::resource_type>_>::clear(&this->allTypes);
  return;
}

Assistant:

void ResourcesAlbum::clear()
{
    clearLeafsContent();
    //---
    std::map<ResourceLeafWrapper*, ResourceContentWrapper*>::iterator cntItr;
    for (cntItr = leafToContentWrapper.begin(); cntItr != leafToContentWrapper.end(); ++cntItr) {
        ResourceContentWrapper* cntWr = cntItr->second;
        delete cntWr;
    }
    leafToContentWrapper.clear();
    //---
    allLeafs.clear();
    allTypes.clear();
}